

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O3

void __thiscall OpenMD::Velocitizer::removeAngularDrift(Velocitizer *this)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  pointer ppSVar4;
  StuntDouble *pSVar5;
  undefined8 uVar6;
  double dVar7;
  double dVar8;
  uint i;
  Molecule *pMVar9;
  uint j;
  long lVar10;
  pointer ppSVar11;
  uint i_1;
  long lVar12;
  double (*inertiaTensor_00) [3];
  Vector<double,_3U> result;
  MoleculeIterator mi;
  Vector<double,_3U> result_4;
  Vector3<double> result_3;
  Vector3d angularMomentum;
  Vector3d com;
  Vector3d vdrift;
  Mat3x3d inertiaTensor;
  double local_1b8 [4];
  SquareMatrix3<double> local_198;
  MoleculeIterator local_150;
  double local_148 [4];
  double local_128;
  double dStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8 [4];
  Vector3d local_c8;
  Vector3d local_a8;
  Vector3d local_88;
  double local_68 [9];
  
  local_88.super_Vector<double,_3U>.data_[0] = 0.0;
  local_88.super_Vector<double,_3U>.data_[1] = 0.0;
  lVar12 = 0;
  local_88.super_Vector<double,_3U>.data_[2] = 0.0;
  local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
  Thermo::getComAll(&this->thermo_,&local_a8,&local_88);
  inertiaTensor_00 = (double (*) [3])local_68;
  local_68[8] = 0.0;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[1] = 0.0;
  Thermo::getInertiaTensor(&this->thermo_,(Mat3x3d *)inertiaTensor_00,&local_c8);
  SquareMatrix3<double>::inverse(&local_198,(SquareMatrix3<double> *)inertiaTensor_00);
  do {
    *(undefined8 *)((long)local_68 + lVar12 + 0x10) =
         *(undefined8 *)
          ((long)local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar12 + 0x10);
    uVar6 = *(undefined8 *)
             ((long)local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0] + lVar12 + 8);
    *(undefined8 *)((long)local_68 + lVar12) =
         *(undefined8 *)
          ((long)local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar12);
    *(undefined8 *)((long)local_68 + lVar12 + 8) = uVar6;
    lVar12 = lVar12 + 0x18;
  } while (lVar12 != 0x48);
  local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  lVar12 = 0;
  do {
    dVar2 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            [lVar12];
    lVar10 = 0;
    do {
      dVar2 = dVar2 + (((SquareMatrix<double,_3> *)*inertiaTensor_00)->
                      super_RectMatrix<double,_3U,_3U>).data_[0][lVar10] *
                      local_c8.super_Vector<double,_3U>.data_[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar12] =
         dVar2;
    lVar12 = lVar12 + 1;
    inertiaTensor_00 = inertiaTensor_00 + 1;
  } while (lVar12 != 3);
  local_118 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  uStack_110 = 0;
  local_128 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  dStack_120 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  local_150._M_node = (_Base_ptr)0x0;
  pMVar9 = SimInfo::beginMolecule(this->info_,&local_150);
  if (pMVar9 != (Molecule *)0x0) {
    local_f8 = -dStack_120;
    dStack_f0 = -local_118;
    local_108 = -local_128;
    dStack_100 = -dStack_120;
    do {
      ppSVar4 = (pMVar9->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppSVar11 = (pMVar9->integrableObjects_).
                      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          (ppSVar11 != ppSVar4 && (pSVar5 = *ppSVar11, pSVar5 != (StuntDouble *)0x0));
          ppSVar11 = ppSVar11 + 1) {
        lVar12 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
        local_1b8[2] = (double)*(undefined8 *)(lVar12 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar12 + (long)pSVar5->localIndex_ * 0x18);
        local_1b8[0] = *pdVar1;
        local_1b8[1] = pdVar1[1];
        local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
        local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
        local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
        lVar12 = 0;
        do {
          local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar12]
               = local_1b8[lVar12] - local_a8.super_Vector<double,_3U>.data_[lVar12];
          dVar8 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [2];
          dVar7 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [1];
          dVar2 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [0];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar12 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).velocity.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
        local_1b8[2] = (double)*(undefined8 *)(lVar12 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar12 + (long)pSVar5->localIndex_ * 0x18);
        local_1b8[0] = *pdVar1;
        local_1b8[1] = pdVar1[1];
        local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
        local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
        local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
        lVar12 = 0;
        do {
          local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar12]
               = local_1b8[lVar12] - local_88.super_Vector<double,_3U>.data_[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_e8[0] = dVar8 * local_128 + dVar7 * local_f8;
        local_e8[1] = dVar2 * dStack_120 + dVar8 * dStack_f0;
        local_e8[2] = dVar2 * local_108 + local_118 * dVar7;
        local_148[0] = 0.0;
        local_148[1] = 0.0;
        local_148[2] = 0.0;
        lVar12 = 0;
        do {
          local_148[lVar12] =
               local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
               [lVar12] - local_e8[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        iVar3 = pSVar5->localIndex_;
        lVar12 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).velocity.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
        *(double *)(lVar12 + 0x10 + (long)iVar3 * 0x18) = local_148[2];
        pdVar1 = (double *)(lVar12 + (long)iVar3 * 0x18);
        *pdVar1 = local_148[0];
        pdVar1[1] = local_148[1];
      }
      pMVar9 = SimInfo::nextMolecule(this->info_,&local_150);
    } while (pMVar9 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void Velocitizer::removeAngularDrift() {
    // Get the Center of Mass drift velocity.

    Vector3d vdrift;
    Vector3d com;

    thermo_.getComAll(com, vdrift);

    Mat3x3d inertiaTensor;
    Vector3d angularMomentum;
    Vector3d omega;

    thermo_.getInertiaTensor(inertiaTensor, angularMomentum);

    // We now need the inverse of the inertia tensor.
    inertiaTensor = inertiaTensor.inverse();
    omega         = inertiaTensor * angularMomentum;

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d tempComPos;

    // Corrects for the center of mass angular drift by summing all
    // the angular momentum and dividing by the total mass.

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        tempComPos = sd->getPos() - com;
        sd->setVel((sd->getVel() - vdrift) - cross(omega, tempComPos));
      }
    }
  }